

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.c
# Opt level: O0

ZyanBool ZydisCheckAsz(ZydisEncoderInstructionMatch *match,ZydisRegisterWidth reg_width)

{
  ZydisRegisterWidth reg_width_local;
  ZydisEncoderInstructionMatch *match_local;
  
  if (0xff < reg_width) {
    __assert_fail("reg_width <= (255)",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                  ,0x2b5,
                  "ZyanBool ZydisCheckAsz(ZydisEncoderInstructionMatch *, ZydisRegisterWidth)");
  }
  if (match->easz == '\0') {
    if ((match->request->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) && (reg_width == 0x10)) {
      match_local._7_1_ = false;
    }
    else {
      match->easz = (ZyanU8)reg_width;
      match_local._7_1_ = true;
    }
  }
  else {
    match_local._7_1_ = match->easz == (ZyanU8)reg_width;
  }
  return match_local._7_1_;
}

Assistant:

static ZyanBool ZydisCheckAsz(ZydisEncoderInstructionMatch *match, ZydisRegisterWidth reg_width)
{
    ZYAN_ASSERT(reg_width <= ZYAN_UINT8_MAX);
    if (match->easz == 0)
    {
        if ((match->request->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) &&
            (reg_width == 16))
        {
            return ZYAN_FALSE;
        }
        match->easz = (ZyanU8)reg_width;
        return ZYAN_TRUE;
    }

    return match->easz == (ZyanU8)reg_width ? ZYAN_TRUE : ZYAN_FALSE;
}